

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O0

double __thiscall Imath_3_2::half::round(half *this,double __x)

{
  char cVar1;
  ushort uVar2;
  uint in_ESI;
  double extraout_XMM0_Qa;
  uint16_t e;
  uint16_t s;
  half h;
  ushort local_18;
  half local_2;
  
  if (in_ESI < 10) {
    cVar1 = (char)in_ESI;
    uVar2 = (ushort)((int)(uint)(this->_h & 0x7fff) >> (9U - cVar1 & 0x1f));
    local_18 = uVar2 + (uVar2 & 1) << (9U - cVar1 & 0x1f);
    if (0x7bff < local_18) {
      local_18 = (short)((int)(uint)this->_h >> (10U - cVar1 & 0x1f)) << (10U - cVar1 & 0x1f);
    }
    half(&local_2,FromBits,this->_h & 0x8000 | local_18);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

inline IMATH_CONSTEXPR14 half
half::round (unsigned int n) const IMATH_NOEXCEPT
{
    //
    // Parameter check.
    //

    if (n >= 10) return *this;

    //
    // Disassemble h into the sign, s,
    // and the combined exponent and significand, e.
    //

    uint16_t s = _h & 0x8000;
    uint16_t e = _h & 0x7fff;

    //
    // Round the exponent and significand to the nearest value
    // where ones occur only in the (10-n) most significant bits.
    // Note that the exponent adjusts automatically if rounding
    // up causes the significand to overflow.
    //

    e >>= 9 - n;
    e += e & 1;
    e <<= 9 - n;

    //
    // Check for exponent overflow.
    //

    if (e >= 0x7c00)
    {
        //
        // Overflow occurred -- truncate instead of rounding.
        //

        e = _h;
        e >>= 10 - n;
        e <<= 10 - n;
    }

    //
    // Put the original sign bit back.
    //

    half h (FromBits, s | e);

    return h;
}